

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O0

void GetBGIPSolverCreatorInstances(Arguments *args,BGIP_SolverCreatorInterface **bgipsc_p)

{
  void *pvVar1;
  BGIP_SolverCreator_MP<JointPolicyPureVectorForClusteredBG> *this;
  BGIP_SolverCreator_Random *this_00;
  undefined8 uVar2;
  long *in_RSI;
  long in_RDI;
  double in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  BGIP_SolverCreator_BFS<JointPolicyPureVector> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  BGIP_SolverCreator_BnB<JointPolicyPureVector> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  BGIP_SolverCreator_CE *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  BGIP_SolverCreator_MP<JointPolicyPureVector> *in_stack_ffffffffffffff90;
  
  if (*(int *)(in_RDI + 0xa0) != 3) {
    if (*(int *)(in_RDI + 0xa0) == 0) {
      *(undefined4 *)(in_RDI + 0xa4) = 0x7fffffff;
    }
    switch(*(undefined4 *)(in_RDI + 0x90)) {
    case 0:
      if (*(int *)(in_RDI + 200) == 0) {
        pvVar1 = operator_new(0x18);
        BGIP_SolverCreator_BFS<JointPolicyPureVector>::BGIP_SolverCreator_BFS
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (size_t)in_stack_ffffffffffffff50);
        *in_RSI = (long)pvVar1;
      }
      else {
        pvVar1 = operator_new(0x18);
        BGIP_SolverCreator_BFS<JointPolicyPureVectorForClusteredBG>::BGIP_SolverCreator_BFS
                  ((BGIP_SolverCreator_BFS<JointPolicyPureVectorForClusteredBG> *)
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (size_t)in_stack_ffffffffffffff50);
        *in_RSI = (long)pvVar1;
      }
      break;
    case 1:
      if (*(int *)(in_RDI + 200) == 0) {
        pvVar1 = operator_new(0x28);
        BGIP_SolverCreator_AM<JointPolicyPureVector>::BGIP_SolverCreator_AM
                  ((BGIP_SolverCreator_AM<JointPolicyPureVector> *)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        *in_RSI = (long)pvVar1;
      }
      else {
        pvVar1 = operator_new(0x28);
        BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>::BGIP_SolverCreator_AM
                  ((BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG> *)
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50);
        *in_RSI = (long)pvVar1;
      }
      break;
    case 2:
      if (*(int *)(in_RDI + 200) != 0) {
        uVar2 = __cxa_allocate_exception(0x28);
        E::E((E *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        __cxa_throw(uVar2,&E::typeinfo,E::~E);
      }
      pvVar1 = operator_new(0x40);
      BGIP_SolverCreator_CE::BGIP_SolverCreator_CE
                (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                 (size_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (size_t)in_stack_ffffffffffffff60,SUB81(in_stack_ffffffffffffff58 >> 0x38,0),
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      *in_RSI = (long)pvVar1;
      break;
    case 3:
      if (*(int *)(in_RDI + 200) == 0) {
        pvVar1 = operator_new(0x50);
        BGIP_SolverCreator_MP<JointPolicyPureVector>::BGIP_SolverCreator_MP
                  (in_stack_ffffffffffffff90,(size_t)pvVar1,(string *)in_stack_ffffffffffffff80,
                   (size_t)in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        *in_RSI = (long)pvVar1;
      }
      else {
        this = (BGIP_SolverCreator_MP<JointPolicyPureVectorForClusteredBG> *)operator_new(0x50);
        BGIP_SolverCreator_MP<JointPolicyPureVectorForClusteredBG>::BGIP_SolverCreator_MP
                  (this,in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80,
                   (size_t)in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        *in_RSI = (long)this;
      }
      break;
    case 4:
      if (*(int *)(in_RDI + 200) == 0) {
        in_stack_ffffffffffffff78 = (char *)operator_new(0x30);
        BGIP_SolverCreator_BnB<JointPolicyPureVector>::BGIP_SolverCreator_BnB
                  (in_stack_ffffffffffffff70,(int)(in_stack_ffffffffffffff68 >> 0x20),
                   (size_t)in_stack_ffffffffffffff60,SUB81(in_stack_ffffffffffffff58 >> 0x38,0),
                   (BnB_JointTypeOrdering)in_stack_ffffffffffffff58,
                   SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),in_stack_ffffffffffffff48);
        *in_RSI = (long)in_stack_ffffffffffffff78;
      }
      else {
        in_stack_ffffffffffffff80 = (BGIP_SolverCreator_CE *)operator_new(0x30);
        BGIP_SolverCreator_BnB<JointPolicyPureVectorForClusteredBG>::BGIP_SolverCreator_BnB
                  ((BGIP_SolverCreator_BnB<JointPolicyPureVectorForClusteredBG> *)
                   in_stack_ffffffffffffff70,(int)(in_stack_ffffffffffffff68 >> 0x20),
                   (size_t)in_stack_ffffffffffffff60,SUB81(in_stack_ffffffffffffff58 >> 0x38,0),
                   (BnB_JointTypeOrdering)in_stack_ffffffffffffff58,
                   SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),in_stack_ffffffffffffff48);
        *in_RSI = (long)in_stack_ffffffffffffff80;
      }
      break;
    case 5:
      if (*(int *)(in_RDI + 200) == 0) {
        pvVar1 = operator_new(0x18);
        BGIP_SolverCreator_BFSNonInc<JointPolicyPureVector>::BGIP_SolverCreator_BFSNonInc
                  ((BGIP_SolverCreator_BFSNonInc<JointPolicyPureVector> *)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
        *in_RSI = (long)pvVar1;
      }
      else {
        pvVar1 = operator_new(0x18);
        BGIP_SolverCreator_BFSNonInc<JointPolicyPureVectorForClusteredBG>::
        BGIP_SolverCreator_BFSNonInc
                  ((BGIP_SolverCreator_BFSNonInc<JointPolicyPureVectorForClusteredBG> *)
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (size_t)in_stack_ffffffffffffff50);
        *in_RSI = (long)pvVar1;
      }
      break;
    case 6:
      uVar2 = __cxa_allocate_exception(0x28);
      E::E((E *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    default:
      uVar2 = __cxa_allocate_exception(0x28);
      E::E((E *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    case 8:
      if (*(int *)(in_RDI + 200) != 0) {
        uVar2 = __cxa_allocate_exception(0x28);
        E::E((E *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        __cxa_throw(uVar2,&E::typeinfo,E::~E);
      }
      this_00 = (BGIP_SolverCreator_Random *)operator_new(0x18);
      BGIP_SolverCreator_Random::BGIP_SolverCreator_Random
                (this_00,(int)(in_stack_ffffffffffffff58 >> 0x20),(size_t)in_stack_ffffffffffffff50)
      ;
      *in_RSI = (long)this_00;
    }
    if ((*in_RSI == 0) && (*in_RSI == 0)) {
      uVar2 = __cxa_allocate_exception(0x28);
      E::E((E *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
  }
  return;
}

Assistant:

void GetBGIPSolverCreatorInstances(
    ArgumentHandlers::Arguments &args,
    BGIP_SolverCreatorInterface * & bgipsc_p
    //BGIP_SolverCreatorInterface_T<JointPolicyPureVector> * &bgsc_p,
    //BGIP_SolverCreatorInterface_T<JointPolicyPureVectorForClusteredBG> * &bgscCluster_p
    )
{
    if(args.gmaa!=MAAstarClassic) // Classic uses a built-in solver
    {
        // for MAAstar we need to make sure we keep all the solutions,
        // so set k to INT_MAX
        if(args.gmaa==MAAstar)
            args.k=INT_MAX;
        switch(args.bgsolver)
        {
        case BFS:
            if(args.useBGclustering)
                bgipsc_p = 
                    new BGIP_SolverCreator_BFS<JointPolicyPureVectorForClusteredBG>(
                        args.verbose, args.k);
            else
                bgipsc_p = new BGIP_SolverCreator_BFS<JointPolicyPureVector>(args.verbose, args.k);
            break;
        case BFSNonInc:
            if(args.useBGclustering)
                bgipsc_p = 
                    new BGIP_SolverCreator_BFSNonInc<JointPolicyPureVectorForClusteredBG>(
                        args.verbose, args.k);
            else
                bgipsc_p = new BGIP_SolverCreator_BFSNonInc<JointPolicyPureVector>(
                    args.verbose, args.k);
            break;
        case AM:
            if(args.useBGclustering)
                bgipsc_p = 
                    new BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>(
                        args.nrAMRestarts, args.verbose, args.k);
            else
                bgipsc_p = new BGIP_SolverCreator_AM<JointPolicyPureVector>(
                    args.nrAMRestarts, args.verbose, args.k);
            break;

        case CE:       
            if(args.useBGclustering)
                throw(E("BGIP_SolverCE does not work yet with clustered policies"));
            else
                bgipsc_p = new BGIP_SolverCreator_CE(
                    args.nrCERestarts,
                    args.nrCEIterations,
                    args.nrCESamples,
                    args.nrCESamplesForUpdate,
                    args.CE_use_hard_threshold,
                    args.CE_alpha);
            break;

        case MaxPlus:
            if(args.useBGclustering)
                bgipsc_p =
                    new BGIP_SolverCreator_MP<JointPolicyPureVectorForClusteredBG> (
                    args.maxplus_maxiter, args.maxplus_updateT, 
                    args.maxplus_verbose, args.maxplus_damping, 
                    args.k,//<- nr solutions to return by BG solver
                    args.maxplus_nrRestarts
                    );
            else
                bgipsc_p = new BGIP_SolverCreator_MP<JointPolicyPureVector> (
                    args.maxplus_maxiter, args.maxplus_updateT, 
                    args.maxplus_verbose, args.maxplus_damping, 
                    args.k,//<- nr solutions to return by BG solver
                    args.maxplus_nrRestarts
                    );
            break;
        case BnB:
            if(args.useBGclustering)
                bgipsc_p =
                    new BGIP_SolverCreator_BnB<JointPolicyPureVectorForClusteredBG>
                    (args.verbose -2 , args.k, args.BnB_keepAll,
                     args.BnBJointTypeOrdering,
                     args.BnB_consistentCompleteInformationHeur);
            else
                bgipsc_p = new BGIP_SolverCreator_BnB<JointPolicyPureVector>
                    (args.verbose -2 , args.k, args.BnB_keepAll,
                     args.BnBJointTypeOrdering,
                     args.BnB_consistentCompleteInformationHeur);
            break;
            
        case CGBG_MaxPlus:
            throw E("CGBG max plus only works with factored Dec-POMDPs (use GMAAF instead)");
            break;

        case Random:
            
            if(args.useBGclustering)
                throw E("Random not implemented for clustered GMAA");
            else
                bgipsc_p = new BGIP_SolverCreator_Random
                    (args.verbose, args.k);
            break;

        default:
            throw E("BGIP_Solver is not handled");
            break;
        }

        if(bgipsc_p == 0 && bgipsc_p == 0)
            throw(E("No BGIP Solver Creator instantiated"));
    }
}